

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void basisu::vector<basist::ktx2_transcoder::key_value>::object_mover
               (void *pDst_void,void *pSrc_void,uint32_t num)

{
  uint in_EDX;
  key_value *in_RSI;
  key_value *in_RDI;
  key_value *pDst;
  key_value *pSrc_end;
  key_value *pSrc;
  key_value *pkVar1;
  
  pkVar1 = in_RSI + in_EDX;
  for (; in_RSI != pkVar1; in_RSI = in_RSI + 1) {
    basist::ktx2_transcoder::key_value::key_value(in_RSI,pkVar1);
    basist::ktx2_transcoder::key_value::~key_value(in_RDI);
    in_RDI = in_RDI + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint32_t num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            // placement new
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            ++pSrc;
            ++pDst;
         }
      }